

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void COVER_best_wait(COVER_best_t *best)

{
  pthread_mutex_t *in_RDI;
  
  if (in_RDI != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock(in_RDI);
    while (*(long *)((long)in_RDI + 0x58) != 0) {
      pthread_cond_wait((pthread_cond_t *)(in_RDI + 1),in_RDI);
    }
    pthread_mutex_unlock(in_RDI);
  }
  return;
}

Assistant:

void COVER_best_wait(COVER_best_t *best) {
  if (!best) {
    return;
  }
  ZSTD_pthread_mutex_lock(&best->mutex);
  while (best->liveJobs != 0) {
    ZSTD_pthread_cond_wait(&best->cond, &best->mutex);
  }
  ZSTD_pthread_mutex_unlock(&best->mutex);
}